

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O1

void __thiscall DCFGReader::buildCFG(DCFGReader *this,int entry)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  int iVar4;
  DCFGReader *pDVar5;
  undefined8 *******pppppppuVar6;
  mapped_type *pmVar7;
  CFG *pCVar8;
  CfgNode *pCVar9;
  CfgNode *pCVar10;
  _List_node_base *p_Var11;
  BlockData *this_00;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Rb_tree_header *p_Var16;
  map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  *this_01;
  int src_id;
  list<int,_std::allocator<int>_> worklist;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int local_c4;
  CFG *local_c0;
  CfgNode *local_b8;
  int local_ac;
  _Base_ptr local_a8;
  DCFGReader *local_a0;
  undefined8 *******local_98;
  undefined8 *******local_90;
  long local_88;
  mapped_type *local_80;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_78;
  map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  *local_70;
  map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
  *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  this_01 = &this->m_nodes;
  local_ac = entry;
  pmVar7 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](this_01,&local_ac);
  local_a0 = this;
  pCVar8 = CFGReader::instance(&this->super_CFGReader,pmVar7->addr);
  if (pCVar8->m_entryNode != (CfgNode *)0x0) {
    __assert_fail("cfg->entryNode() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0x44,"void DCFGReader::buildCFG(int)");
  }
  pCVar9 = (CfgNode *)operator_new(0x18);
  CfgNode::CfgNode(pCVar9,CFG_ENTRY);
  CFG::addNode(pCVar8,pCVar9);
  pmVar7 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](this_01,&local_ac);
  pCVar10 = CFG::nodeByAddr(pCVar8,pmVar7->addr);
  if (pCVar10 != (CfgNode *)0x0) {
    __assert_fail("cfg->nodeByAddr(m_nodes[entry].addr) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0x49,"void DCFGReader::buildCFG(int)");
  }
  pmVar7 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](this_01,&local_ac);
  pCVar10 = CFGReader::nodeWithAddr(pCVar8,pmVar7->addr);
  CFG::addEdge(pCVar8,pCVar9,pCVar10,pCVar8->m_execs);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = 0;
  local_98 = &local_98;
  local_90 = &local_98;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var11[1]._M_next = local_ac;
  std::__detail::_List_node_base::_M_hook(p_Var11);
  local_88 = local_88 + 1;
  if ((undefined8 ********)local_98 != &local_98) {
    local_68 = &local_a0->m_edges;
    p_Var1 = &(local_a0->m_nodes)._M_t._M_impl.super__Rb_tree_header;
    local_a8 = &(local_a0->m_visited)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &local_a0->m_visited;
    local_c0 = pCVar8;
    local_70 = this_01;
    do {
      pppppppuVar6 = local_98;
      local_c4 = *(int *)(local_98 + 2);
      local_88 = local_88 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(pppppppuVar6);
      if (local_c4 < 4) {
        __assert_fail("src_id > 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                      ,0x54,"void DCFGReader::buildCFG(int)");
      }
      p_Var14 = &local_60._M_impl.super__Rb_tree_header._M_header;
      for (p_Var15 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var15 != (_Rb_tree_header *)0x0;
          p_Var15 = (&p_Var15->_M_left)[(int)*(size_t *)(p_Var15 + 1) < local_c4]) {
        if (local_c4 <= (int)*(size_t *)(p_Var15 + 1)) {
          p_Var14 = p_Var15;
        }
      }
      p_Var2 = &local_60._M_impl.super__Rb_tree_header;
      p_Var16 = p_Var2;
      if (((_Rb_tree_header *)p_Var14 != p_Var2) &&
         (p_Var16 = (_Rb_tree_header *)p_Var14,
         local_c4 < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
        p_Var16 = p_Var2;
      }
      if (p_Var16 == p_Var2) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&local_c4);
        local_80 = std::
                   map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
                   ::operator[](this_01,&local_c4);
        pCVar9 = CFG::nodeByAddr(pCVar8,local_80->addr);
        if ((pCVar9 == (CfgNode *)0x0) || (pCVar9->m_type != CFG_PHANTOM)) {
          __assert_fail("src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                        ,0x5c,"void DCFGReader::buildCFG(int)");
        }
        this_00 = (BlockData *)operator_new(0x90);
        CfgNode::BlockData::BlockData(this_00,local_80->addr,local_80->size,false);
        CfgNode::setData(pCVar9,(Data *)this_00);
        local_b8 = pCVar9;
        p_Var12 = (_List_node_base *)
                  std::
                  map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
                  ::operator[](local_68,&local_c4);
        for (p_Var11 = (((_List_base<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_> *)
                        &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            pDVar5 = local_a0, p_Var11 != p_Var12;
            p_Var11 = (((_List_base<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_> *)
                       &p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
          iVar3 = *(int *)&p_Var11[1]._M_next;
          if (iVar3 == 3) goto LAB_0010dbf6;
          p_Var14 = (local_a0->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 = &p_Var1->_M_header;
          for (; p_Var14 != (_Base_ptr)0x0;
              p_Var14 = (&p_Var14->_M_left)[(int)p_Var14[1]._M_color < iVar3]) {
            if (iVar3 <= (int)p_Var14[1]._M_color) {
              p_Var15 = p_Var14;
            }
          }
          p_Var14 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
             (p_Var14 = p_Var15, iVar3 < (int)p_Var15[1]._M_color)) {
            p_Var14 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var14 == p_Var1) {
            p_Var14 = (_Base_ptr)0x0;
          }
          else {
            p_Var14 = p_Var14[1]._M_parent;
          }
          iVar4 = *(int *)((long)&p_Var11[1]._M_next + 4);
          if (0x17 < iVar4 - 2U) {
switchD_0010da2d_caseD_3:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                          ,0x95,"void DCFGReader::buildCFG(int)");
          }
          p_Var13 = p_Var11[1]._M_prev;
          switch(iVar4) {
          case 2:
            if (iVar3 != 2) {
              __assert_fail("edge.dst_id == 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                            ,0x86,"void DCFGReader::buildCFG(int)");
            }
            pCVar9 = CFGReader::haltNode(local_c0);
            goto LAB_0010dbe1;
          default:
            goto switchD_0010da2d_caseD_3;
          case 5:
            CFGReader::markIndirect(local_b8);
          case 4:
          case 0x13:
            pDVar5 = local_a0;
            pCVar8 = CFGReader::instance(&local_a0->super_CFGReader,(Addr)p_Var14);
            p_Var15 = local_a8;
            for (p_Var14 = (pDVar5->m_visited)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent; p_Var14 != (_Base_ptr)0x0;
                p_Var14 = (&p_Var14->_M_left)[(int)p_Var14[1]._M_color < local_c4]) {
              if (local_c4 <= (int)p_Var14[1]._M_color) {
                p_Var15 = p_Var14;
              }
            }
            p_Var14 = local_a8;
            if ((p_Var15 != local_a8) && (p_Var14 = p_Var15, local_c4 < (int)p_Var15[1]._M_color)) {
              p_Var14 = local_a8;
            }
            CFGReader::addCall(local_b8,pCVar8,(unsigned_long_long)p_Var13,p_Var14 == local_a8);
            break;
          case 6:
            pCVar9 = CFGReader::exitNode(local_c0);
LAB_0010dbe1:
            CFG::addEdge(local_c0,local_b8,pCVar9,(unsigned_long_long)p_Var13);
            break;
          case 0xd:
            pCVar9 = CFGReader::nodeWithAddr(local_c0,(Addr)p_Var14);
            CFG::addEdge(local_c0,local_b8,pCVar9,(unsigned_long_long)p_Var13);
            pCVar9 = CFGReader::nodeWithAddr(local_c0,(long)local_80->size + local_80->addr);
            p_Var13 = (_List_node_base *)0x0;
LAB_0010da3c:
            CFG::addEdge(local_c0,local_b8,pCVar9,(unsigned_long_long)p_Var13);
            p_Var13 = (_List_node_base *)operator_new(0x18);
            *(undefined4 *)&p_Var13[1]._M_next = *(undefined4 *)&p_Var11[1]._M_next;
            std::__detail::_List_node_base::_M_hook(p_Var13);
            local_88 = local_88 + 1;
            break;
          case 0x10:
            CFGReader::markIndirect(local_b8);
          case 7:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x15:
          case 0x19:
            pCVar9 = CFGReader::nodeWithAddr(local_c0,(Addr)p_Var14);
            goto LAB_0010da3c;
          case 0x16:
            pCVar8 = CFGReader::instance(&local_a0->super_CFGReader,(Addr)p_Var14);
            p_Var15 = local_a8;
            for (p_Var14 = (pDVar5->m_visited)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent; p_Var14 != (_Base_ptr)0x0;
                p_Var14 = (&p_Var14->_M_left)[(int)p_Var14[1]._M_color < local_c4]) {
              if (local_c4 <= (int)p_Var14[1]._M_color) {
                p_Var15 = p_Var14;
              }
            }
            p_Var14 = local_a8;
            if ((p_Var15 != local_a8) && (p_Var14 = p_Var15, local_c4 < (int)p_Var15[1]._M_color)) {
              p_Var14 = local_a8;
            }
            CFGReader::addSignalHandler
                      (local_b8,0,pCVar8,(unsigned_long_long)p_Var13,p_Var14 == local_a8);
          }
LAB_0010dbf6:
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_78,&local_c4);
        this_01 = local_70;
        pCVar8 = local_c0;
      }
    } while ((undefined8 ********)local_98 != &local_98);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void DCFGReader::buildCFG(int entry) {
	CFG* cfg = this->instance(m_nodes[entry].addr);

	// Add special entry node.
	assert(cfg->entryNode() == 0);
	CfgNode* entry_node = new CfgNode(CfgNode::CFG_ENTRY);
	cfg->addNode(entry_node);

	// Add the first node.
	assert(cfg->nodeByAddr(m_nodes[entry].addr) == 0);
	cfg->addEdge(entry_node, CFGReader::nodeWithAddr(cfg, m_nodes[entry].addr),
					cfg->execs());

	std::set<int> visited;
	std::list<int> worklist;
	worklist.push_back(entry);

	while (!worklist.empty()) {
		int src_id = worklist.front();
		worklist.pop_front();
		assert(src_id > 3);

		if (visited.find(src_id) != visited.cend())
			continue;
		visited.insert(src_id);

		DCFGReader::Node& src_bb = m_nodes[src_id];
		CfgNode* src_node = cfg->nodeByAddr(src_bb.addr);
		assert(src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM);
		src_node->setData(new CfgNode::BlockData(src_bb.addr, src_bb.size));

		for (DCFGReader::Edge& edge : m_edges[src_id]) {
			// Ignore unknown node.
			if (edge.dst_id == UNKNOWN_NODE)
				continue;

			std::map<int, Node>::const_iterator it = m_nodes.find(edge.dst_id);
			Addr dst_addr = (it != m_nodes.end() ? (it->second).addr : 0);

			unsigned long long count = edge.count;

			switch (edge.edge_type) {
				case INDIRECT_UNCONDITIONAL_BRANCH_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough.
				case REP_EDGE:
				case CALL_BYPASS_EDGE:
				case SYSTEM_CALL_BYPASS_EDGE:
				case DIRECT_UNCONDITIONAL_BRANCH_EDGE:
				case FALL_THROUGH_EDGE:
				case EXCLUDED_CODE_BYPASS_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					worklist.push_back(edge.dst_id);
					break;
				case DIRECT_CONDITIONAL_BRANCH_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, src_bb.addr + src_bb.size));
					worklist.push_back(edge.dst_id);
					break;
				case INDIRECT_CALL_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough
				case SYSTEM_CALL_EDGE:
				case DIRECT_CALL_EDGE: {
					CFG* called = this->instance(dst_addr);
					CFGReader::addCall(src_node, called, count,
						m_visited.find(src_id) == m_visited.cend());
					} break;
				case EXIT_EDGE:
					// The destination must be the special exit node (2).
					assert(edge.dst_id == 2);
					cfg->addEdge(src_node, CFGReader::haltNode(cfg), count);
					break;
				case RETURN_EDGE:
					cfg->addEdge(src_node, CFGReader::exitNode(cfg), count);
					break;
				case CONTEXT_CHANGE_EDGE: {
					CFG* sigHandler = this->instance(dst_addr);
					CFGReader::addSignalHandler(src_node, 0, sigHandler, count,
						m_visited.find(src_id) == m_visited.cend());

					} break;
				default: {
					// std::vector<std::string> edgeTypes = readStrings(obj, "EDGE_TYPES");
					// std::cout << "edge type: " << edgeTypes[edge.edge_type] << "\n";
					assert(false);
					} break;
			}
		}

		// Added to the global visited ids.
		m_visited.insert(src_id);
	}
}